

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O2

void __thiscall tst_RootIndexProxyModel::insertColumn(tst_RootIndexProxyModel *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QAbstractItemModel *parent;
  ModelTest *this_00;
  QList<QVariant> arguments;
  Data *local_280;
  QVariant *local_278;
  QAbstractItemModel *pQStack_270;
  RootIndexProxyModel proxyModel;
  QModelIndex local_250;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 uStack_228;
  QSignalSpy proxyColumnsAboutToBeInsertedSpy;
  QSignalSpy proxyColumnsInsertedSpy;
  QSignalSpy sourceColumnsInsertedSpy;
  QSignalSpy sourceColumnsAboutToBeInsertedSpy;
  
  parent = createTreeModel(&this->super_QObject);
  RootIndexProxyModel::RootIndexProxyModel(&proxyModel,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&proxyModel,(QObject *)parent);
  RootIndexProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
  proxyColumnsInsertedSpy.super_QObject = (QObject)0xff;
  proxyColumnsInsertedSpy._1_7_ = 0xffffffffffffff;
  proxyColumnsInsertedSpy._8_8_ = 0;
  proxyColumnsInsertedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  (**(code **)(*(long *)parent + 0x60))(&proxyColumnsAboutToBeInsertedSpy,parent,1,0);
  RootIndexProxyModel::setRootIndex((QModelIndex *)&proxyModel);
  QSignalSpy::QSignalSpy
            (&proxyColumnsAboutToBeInsertedSpy,(QObject *)&proxyModel,
             "2columnsAboutToBeInserted(QModelIndex, int, int)");
  cVar1 = QTest::qVerify(proxyColumnsAboutToBeInsertedSpy.sig.d.size != 0,
                         "proxyColumnsAboutToBeInsertedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                         ,0xd0);
  if (cVar1 != '\0') {
    QSignalSpy::QSignalSpy
              (&proxyColumnsInsertedSpy,(QObject *)&proxyModel,
               "2columnsInserted(QModelIndex, int, int)");
    cVar1 = QTest::qVerify(proxyColumnsInsertedSpy.sig.d.size != 0,
                           "proxyColumnsInsertedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                           ,0xd2);
    if (cVar1 != '\0') {
      QSignalSpy::QSignalSpy
                (&sourceColumnsAboutToBeInsertedSpy,(QObject *)parent,
                 "2columnsAboutToBeInserted(QModelIndex, int, int)");
      cVar1 = QTest::qVerify(sourceColumnsAboutToBeInsertedSpy.sig.d.size != 0,
                             "sourceColumnsAboutToBeInsertedSpy.isValid()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                             ,0xd4);
      if (cVar1 != '\0') {
        QSignalSpy::QSignalSpy
                  (&sourceColumnsInsertedSpy,(QObject *)parent,
                   "2columnsInserted(QModelIndex, int, int)");
        cVar1 = QTest::qVerify(sourceColumnsInsertedSpy.sig.d.size != 0,
                               "sourceColumnsInsertedSpy.isValid()","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                               ,0xd6);
        if (cVar1 != '\0') {
          local_280 = (Data *)0xffffffffffffffff;
          local_278 = (QVariant *)0x0;
          pQStack_270 = (QAbstractItemModel *)0x0;
          (**(code **)(*(long *)parent + 0x60))(&arguments,parent,1,0);
          iVar3 = (**(code **)(*(long *)parent + 0x80))(parent,&arguments);
          arguments.d.d = (Data *)0xffffffffffffffff;
          arguments.d.ptr = (QVariant *)0x0;
          arguments.d.size = 0;
          iVar4 = RootIndexProxyModel::columnCount((QModelIndex *)&proxyModel);
          cVar1 = QTest::qCompare(iVar3,iVar4,"oldColCount","proxyModel.columnCount()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                  ,0xd8);
          if (cVar1 != '\0') {
            arguments.d.d = (Data *)0xffffffffffffffff;
            arguments.d.ptr = (QVariant *)0x0;
            arguments.d.size = 0;
            RootIndexProxyModel::insertColumns((int)&proxyModel,1,(QModelIndex *)0x1);
            arguments.d.d = (Data *)0xffffffffffffffff;
            arguments.d.ptr = (QVariant *)0x0;
            arguments.d.size = 0;
            iVar4 = RootIndexProxyModel::columnCount((QModelIndex *)&proxyModel);
            cVar1 = QTest::qCompare(iVar3 + 1,iVar4,"oldColCount + 1","proxyModel.columnCount()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                    ,0xda);
            if (cVar1 != '\0') {
              local_280 = (Data *)0xffffffffffffffff;
              local_278 = (QVariant *)0x0;
              pQStack_270 = (QAbstractItemModel *)0x0;
              (**(code **)(*(long *)parent + 0x60))(&arguments,parent,1,0);
              iVar4 = (**(code **)(*(long *)parent + 0x80))(parent,&arguments);
              cVar1 = QTest::qCompare(iVar3 + 1,iVar4,"oldColCount + 1",
                                      "baseModel->columnCount(baseModel->index(1, 0))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                      ,0xdb);
              if (cVar1 != '\0') {
                cVar1 = QTest::qCompare(proxyColumnsAboutToBeInsertedSpy.
                                        super_QList<QList<QVariant>_>.d.size,1,
                                        "proxyColumnsAboutToBeInsertedSpy.count()","1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                        ,0xdc);
                if (cVar1 != '\0') {
                  QList<QList<QVariant>_>::takeFirst
                            (&arguments,
                             &proxyColumnsAboutToBeInsertedSpy.super_QList<QList<QVariant>_>);
                  qvariant_cast<QModelIndex>((QModelIndex *)&local_280,arguments.d.ptr);
                  local_250.r = -1;
                  local_250.c = -1;
                  local_250.i = 0;
                  local_250.m = (QAbstractItemModel *)0x0;
                  bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                    ((QModelIndex *)&local_280,&local_250,
                                     "arguments.at(0).value<QModelIndex>()","QModelIndex()",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                     ,0xde);
                  if (bVar2) {
                    iVar3 = qvariant_cast<int>(arguments.d.ptr + 1);
                    cVar1 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()","1",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                            ,0xdf);
                    if (cVar1 != '\0') {
                      iVar3 = qvariant_cast<int>(arguments.d.ptr + 2);
                      cVar1 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()","1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                              ,0xe0);
                      if (cVar1 != '\0') {
                        cVar1 = QTest::qCompare(proxyColumnsInsertedSpy.
                                                super_QList<QList<QVariant>_>.d.size,1,
                                                "proxyColumnsInsertedSpy.count()","1",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                ,0xe1);
                        if (cVar1 != '\0') {
                          QList<QList<QVariant>_>::takeFirst
                                    ((value_type *)&local_280,
                                     &proxyColumnsInsertedSpy.super_QList<QList<QVariant>_>);
                          QArrayDataPointer<QVariant>::operator=
                                    (&arguments.d,(QArrayDataPointer<QVariant> *)&local_280);
                          QArrayDataPointer<QVariant>::~QArrayDataPointer
                                    ((QArrayDataPointer<QVariant> *)&local_280);
                          qvariant_cast<QModelIndex>((QModelIndex *)&local_280,arguments.d.ptr);
                          local_250.r = -1;
                          local_250.c = -1;
                          local_250.i = 0;
                          local_250.m = (QAbstractItemModel *)0x0;
                          bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                            ((QModelIndex *)&local_280,&local_250,
                                             "arguments.at(0).value<QModelIndex>()","QModelIndex()",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                             ,0xe3);
                          if (bVar2) {
                            iVar3 = qvariant_cast<int>(arguments.d.ptr + 1);
                            cVar1 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()","1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xe4);
                            if (cVar1 != '\0') {
                              iVar3 = qvariant_cast<int>(arguments.d.ptr + 2);
                              cVar1 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()","1",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xe5);
                              if (cVar1 != '\0') {
                                cVar1 = QTest::qCompare(sourceColumnsAboutToBeInsertedSpy.
                                                        super_QList<QList<QVariant>_>.d.size,1,
                                                        "sourceColumnsAboutToBeInsertedSpy.count()",
                                                        "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xe6);
                                if (cVar1 != '\0') {
                                  QList<QList<QVariant>_>::takeFirst
                                            ((value_type *)&local_280,
                                             &sourceColumnsAboutToBeInsertedSpy.
                                              super_QList<QList<QVariant>_>);
                                  QArrayDataPointer<QVariant>::operator=
                                            (&arguments.d,(QArrayDataPointer<QVariant> *)&local_280)
                                  ;
                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                            ((QArrayDataPointer<QVariant> *)&local_280);
                                  qvariant_cast<QModelIndex>
                                            ((QModelIndex *)&local_280,arguments.d.ptr);
                                  local_238 = 0xffffffffffffffff;
                                  local_230 = 0;
                                  uStack_228 = 0;
                                  (**(code **)(*(long *)parent + 0x60))(&local_250,parent,1,0);
                                  bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                                    ((QModelIndex *)&local_280,&local_250,
                                                     "arguments.at(0).value<QModelIndex>()",
                                                     "baseModel->index(1, 0)",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xe8);
                                  if (bVar2) {
                                    iVar3 = qvariant_cast<int>(arguments.d.ptr + 1);
                                    cVar1 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()",
                                                            "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xe9);
                                    if (cVar1 != '\0') {
                                      iVar3 = qvariant_cast<int>(arguments.d.ptr + 2);
                                      cVar1 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()"
                                                              ,"1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xea);
                                      if (cVar1 != '\0') {
                                        cVar1 = QTest::qCompare(sourceColumnsInsertedSpy.
                                                                super_QList<QList<QVariant>_>.d.size
                                                                ,1,
                                                  "sourceColumnsInsertedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xeb);
                                        if (cVar1 != '\0') {
                                          QList<QList<QVariant>_>::takeFirst
                                                    ((value_type *)&local_280,
                                                     &sourceColumnsInsertedSpy.
                                                      super_QList<QList<QVariant>_>);
                                          QArrayDataPointer<QVariant>::operator=
                                                    (&arguments.d,
                                                     (QArrayDataPointer<QVariant> *)&local_280);
                                          QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                    ((QArrayDataPointer<QVariant> *)&local_280);
                                          qvariant_cast<QModelIndex>
                                                    ((QModelIndex *)&local_280,arguments.d.ptr);
                                          local_238 = 0xffffffffffffffff;
                                          local_230 = 0;
                                          uStack_228 = 0;
                                          (**(code **)(*(long *)parent + 0x60))
                                                    (&local_250,parent,1,0);
                                          bVar2 = QTest::qCompare<QModelIndex,QModelIndex>
                                                            ((QModelIndex *)&local_280,&local_250,
                                                             "arguments.at(0).value<QModelIndex>()",
                                                             "baseModel->index(1, 0)",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xed);
                                          if (bVar2) {
                                            iVar3 = qvariant_cast<int>(arguments.d.ptr + 1);
                                            cVar1 = QTest::qCompare(iVar3,1,
                                                  "arguments.at(1).value<int>()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xee);
                                            if (cVar1 != '\0') {
                                              iVar3 = qvariant_cast<int>(arguments.d.ptr + 2);
                                              cVar1 = QTest::qCompare(iVar3,1,
                                                  "arguments.at(2).value<int>()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xef);
                                              if (cVar1 != '\0') {
                                                QObject::deleteLater();
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  QArrayDataPointer<QVariant>::~QArrayDataPointer(&arguments.d);
                }
              }
            }
          }
        }
        QSignalSpy::~QSignalSpy(&sourceColumnsInsertedSpy);
      }
      QSignalSpy::~QSignalSpy(&sourceColumnsAboutToBeInsertedSpy);
    }
    QSignalSpy::~QSignalSpy(&proxyColumnsInsertedSpy);
  }
  QSignalSpy::~QSignalSpy(&proxyColumnsAboutToBeInsertedSpy);
  RootIndexProxyModel::~RootIndexProxyModel(&proxyModel);
  return;
}

Assistant:

void tst_RootIndexProxyModel::insertColumn()
{
#ifdef COMPLEX_MODEL_SUPPORT
    QAbstractItemModel *baseModel = createTreeModel(this);
    RootIndexProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.setSourceModel(baseModel);
    proxyModel.setRootIndex(baseModel->index(1, 0));
    QSignalSpy proxyColumnsAboutToBeInsertedSpy(&proxyModel, SIGNAL(columnsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(proxyColumnsAboutToBeInsertedSpy.isValid());
    QSignalSpy proxyColumnsInsertedSpy(&proxyModel, SIGNAL(columnsInserted(QModelIndex, int, int)));
    QVERIFY(proxyColumnsInsertedSpy.isValid());
    QSignalSpy sourceColumnsAboutToBeInsertedSpy(baseModel, SIGNAL(columnsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(sourceColumnsAboutToBeInsertedSpy.isValid());
    QSignalSpy sourceColumnsInsertedSpy(baseModel, SIGNAL(columnsInserted(QModelIndex, int, int)));
    QVERIFY(sourceColumnsInsertedSpy.isValid());
    int oldColCount = baseModel->columnCount(baseModel->index(1, 0));
    QCOMPARE(oldColCount, proxyModel.columnCount());
    proxyModel.insertColumns(1, 1);
    QCOMPARE(oldColCount + 1, proxyModel.columnCount());
    QCOMPARE(oldColCount + 1, baseModel->columnCount(baseModel->index(1, 0)));
    QCOMPARE(proxyColumnsAboutToBeInsertedSpy.count(), 1);
    QList<QVariant> arguments = proxyColumnsAboutToBeInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), QModelIndex());
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(proxyColumnsInsertedSpy.count(), 1);
    arguments = proxyColumnsInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), QModelIndex());
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(sourceColumnsAboutToBeInsertedSpy.count(), 1);
    arguments = sourceColumnsAboutToBeInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), baseModel->index(1, 0));
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(sourceColumnsInsertedSpy.count(), 1);
    arguments = sourceColumnsInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), baseModel->index(1, 0));
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    baseModel->deleteLater();
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}